

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

void Abc_NtkVerifyReportError(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel)

{
  Abc_Ntk_t *pNtk;
  int *piVar1;
  uint uVar2;
  int *__ptr;
  int *__ptr_00;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  Vec_Ptr_t *__ptr_01;
  Abc_Obj_t *pAVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  Abc_Obj_t *pNode;
  Abc_Obj_t *local_48;
  Abc_Ntk_t *local_40;
  int *local_38;
  
  if (pNtk1->vCis->nSize != pNtk2->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x2eb,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  if (pNtk1->vCos->nSize != pNtk2->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x2ec,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  __ptr = Abc_NtkVerifySimulatePattern(pNtk1,pModel);
  local_38 = pModel;
  __ptr_00 = Abc_NtkVerifySimulatePattern(pNtk2,pModel);
  lVar3 = (long)pNtk1->vCos->nSize;
  uVar10 = 0;
  uVar9 = 0;
  if (0 < lVar3) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + (__ptr[lVar8] != __ptr_00[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar3 != lVar8);
  }
  printf("Verification failed for at least %d outputs: ",(ulong)uVar9);
  pVVar4 = pNtk1->vCos;
  local_40 = pNtk1;
  if (pVVar4->nSize < 1) {
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = 0xffffffff;
    lVar3 = 0;
    uVar10 = 0;
    do {
      if (__ptr[lVar3] != __ptr_00[lVar3]) {
        uVar2 = (uint)lVar3;
        if (uVar7 != 0xffffffff) {
          uVar2 = uVar7;
        }
        uVar7 = uVar2;
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar4->pArray[lVar3]);
        printf(" %s",pcVar5);
        uVar10 = uVar10 + 1;
        if (uVar10 == 3) {
          uVar10 = 3;
          break;
        }
        pVVar4 = local_40->vCos;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  if (uVar10 != uVar9) {
    printf(" ...");
  }
  putchar(10);
  piVar1 = local_38;
  pNtk = local_40;
  if ((int)uVar7 < 0) {
LAB_00320adc:
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    return;
  }
  if ((int)uVar7 < local_40->vCos->nSize) {
    pcVar5 = Abc_ObjName((Abc_Obj_t *)local_40->vCos->pArray[uVar7]);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar5,
           (ulong)(uint)__ptr[uVar7],(ulong)(uint)__ptr_00[uVar7]);
    printf("Input pattern: ");
    if ((int)uVar7 < pNtk->vCos->nSize) {
      local_48 = (Abc_Obj_t *)pNtk->vCos->pArray[uVar7];
      __ptr_01 = Abc_NtkNodeSupport(pNtk,&local_48,1);
      pVVar4 = pNtk->vCis;
      if (0 < pVVar4->nSize) {
        pAVar6 = (Abc_Obj_t *)0x0;
        do {
          local_48 = (Abc_Obj_t *)pVVar4->pArray[(long)pAVar6];
          (local_48->field_6).pCopy = pAVar6;
          pAVar6 = (Abc_Obj_t *)((long)&pAVar6->pNtk + 1);
          pVVar4 = pNtk->vCis;
        } while ((long)pAVar6 < (long)pVVar4->nSize);
      }
      if (0 < __ptr_01->nSize) {
        local_48 = (Abc_Obj_t *)*__ptr_01->pArray;
        uVar9 = *(uint *)&local_48->field_0x14 & 0xf;
        if ((uVar9 == 5) || (uVar9 == 2)) {
          lVar3 = 0;
          do {
            local_48 = (Abc_Obj_t *)__ptr_01->pArray[lVar3];
            uVar9 = *(uint *)&local_48->field_0x14 & 0xf;
            if ((uVar9 != 2) && (uVar9 != 5)) {
              __assert_fail("Abc_ObjIsCi(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                            ,0x315,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
              ;
            }
            pcVar5 = Abc_ObjName(local_48);
            printf(" %s=%d",pcVar5,(ulong)(uint)piVar1[(local_48->field_6).iTemp]);
            lVar3 = lVar3 + 1;
          } while (lVar3 < __ptr_01->nSize);
        }
        putchar(10);
        if (__ptr_01->pArray != (void **)0x0) {
          free(__ptr_01->pArray);
        }
        free(__ptr_01);
        goto LAB_00320adc;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkVerifyReportError( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, Vec_Int_t * mismatch )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;    
    int nErrors, nPrinted, i, iNode = -1;

    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    // get the CO values under this model
    pValues1__ = Abc_NtkVerifySimulatePattern( pNtk1, pModel );
    pValues2__ = Abc_NtkVerifySimulatePattern( pNtk2, pModel );
    // count the mismatches
    nErrors = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        nErrors += (int)( pValues1__[i] != pValues2__[i] );
    //printf( "Verification failed for at least %d outputs: ", nErrors );
    // print the first 3 outputs
    nPrinted = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        if ( pValues1__[i] != pValues2__[i] )
        {
            if ( iNode == -1 )
                iNode = i;
            //printf( " %s", Abc_ObjName(Abc_NtkCo(pNtk1,i)) );
            if ( ++nPrinted == 3 )
                break;
        }
    /*if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );*/
    // report mismatch for the first output
    if ( iNode >= 0 )
    {
        /*printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
            Abc_ObjName(Abc_NtkCo(pNtk1,iNode)), pValues1[iNode], pValues2[iNode] );
        printf( "Input pattern: " );*/
        // collect PIs in the cone
        pNode = Abc_NtkCo(pNtk1,iNode);
        vNodes = Abc_NtkNodeSupport( pNtk1, &pNode, 1 );
        // set the PI numbers
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = i;
        // print the model
        pNode = (Abc_Obj_t *)Vec_PtrEntry( vNodes, 0 );
        if ( Abc_ObjIsCi(pNode) )
        {
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            {
                assert( Abc_ObjIsCi(pNode) );
                //printf( " %s=%d", Abc_ObjName(pNode), pModel[(int)pNode->pCopy] );
                Vec_IntPush(mismatch, Abc_ObjId(pNode)-1);
                Vec_IntPush(mismatch, pModel[(int)(size_t)pNode->pCopy]);
            }
        }
        //printf( "\n" );
        Vec_PtrFree( vNodes );
    }
    free( pValues1__ );
    free( pValues2__ );
}